

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# API.cpp
# Opt level: O2

void __thiscall AGSSockAPI::Thread::exit(Thread *this,int __status)

{
  Mutex *__mutex;
  
  if (this->data != (Data *)0x0) {
    __mutex = &this->data->mutex;
    pthread_mutex_lock((pthread_mutex_t *)__mutex);
    this->data->active = false;
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    return;
  }
  __assert_fail("data != nullptr",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FTPlus[P]AGSsock/src/API.cpp"
                ,0x119,"void AGSSockAPI::Thread::exit()");
}

Assistant:

void Thread::exit()
{
	assert(data != nullptr);

	{
		Mutex::Lock lock(data->mutex);

		data->active = false;
	}
}